

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O1

void __thiscall
MissingDependencyScanner::MissingDependencyScanner
          (MissingDependencyScanner *this,MissingDependencyScannerDelegate *delegate,
          DepsLog *deps_log,State *state,DiskInterface *disk_interface)

{
  _Rb_tree_header *p_Var1;
  
  this->delegate_ = delegate;
  this->deps_log_ = deps_log;
  this->state_ = state;
  this->disk_interface_ = disk_interface;
  p_Var1 = &(this->seen_)._M_t._M_impl.super__Rb_tree_header;
  (this->seen_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->seen_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->seen_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->seen_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->seen_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header;
  (this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->nodes_missing_deps_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header;
  (this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generated_nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->generator_rules_)._M_t._M_impl.super__Rb_tree_header;
  (this->generator_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->generator_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->generator_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->generator_rules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->generator_rules_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->missing_dep_path_count_ = 0;
  (this->adjacency_map_)._M_h._M_buckets = &(this->adjacency_map_)._M_h._M_single_bucket;
  (this->adjacency_map_)._M_h._M_bucket_count = 1;
  (this->adjacency_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->adjacency_map_)._M_h._M_element_count = 0;
  (this->adjacency_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->adjacency_map_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->adjacency_map_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

MissingDependencyScanner::MissingDependencyScanner(
    MissingDependencyScannerDelegate* delegate, DepsLog* deps_log, State* state,
    DiskInterface* disk_interface)
    : delegate_(delegate), deps_log_(deps_log), state_(state),
      disk_interface_(disk_interface), missing_dep_path_count_(0) {}